

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bign96.c
# Opt level: O1

size_t bign96ParamsVal_deep(size_t n,size_t f_deep,size_t ec_d,size_t ec_deep)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  
  sVar1 = beltHash_keep();
  sVar2 = beltHash_keep();
  sVar3 = ecpIsValid_deep(n,f_deep);
  sVar4 = ecpIsSafeGroup_deep(n);
  sVar5 = ecpIsOnA_deep(n,f_deep);
  sVar6 = qrPower_deep(n,n,f_deep);
  sVar7 = ecHasOrderA_deep(n,ec_d,ec_deep,n);
  sVar2 = utilMax(6,sVar2,sVar3,sVar4,sVar5,sVar6,sVar7);
  return sVar2 + sVar1 + 0x40;
}

Assistant:

static size_t bign96ParamsVal_deep(size_t n, size_t f_deep, size_t ec_d,
	size_t ec_deep)
{
	return beltHash_keep() + O_OF_B(512) +
		utilMax(6,
			beltHash_keep(),
			ecpIsValid_deep(n, f_deep),
			ecpIsSafeGroup_deep(n),
			ecpIsOnA_deep(n, f_deep),
			qrPower_deep(n, n, f_deep),
			ecHasOrderA_deep(n, ec_d, ec_deep, n));
}